

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC.c
# Opt level: O3

void Hacl_HMAC_compute_blake2b_32
               (uint8_t *dst,uint8_t *key,uint32_t key_len,uint8_t *data,uint32_t data_len)

{
  uint *output;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 prev [16];
  undefined1 prev_00 [16];
  undefined1 prev_01 [16];
  undefined1 prev_02 [16];
  undefined1 prev_03 [16];
  undefined1 auVar4 [16];
  uint64_t *puVar5;
  long lVar6;
  uint uVar7;
  uint32_t rem;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint local_3c8 [64];
  uint64_t uStack_2c8;
  uint64_t wv0 [16];
  uint64_t wv1 [16];
  uint64_t wv [16];
  uint64_t s [16];
  uint auStack_c0 [30];
  uint8_t *local_48;
  uint *local_40;
  uint8_t *local_38;
  
  auStack_c0[0x1a] = 0;
  auStack_c0[0x1b] = 0;
  auStack_c0[0x1c] = 0;
  auStack_c0[0x1d] = 0;
  auStack_c0[0x16] = 0;
  auStack_c0[0x17] = 0;
  auStack_c0[0x18] = 0;
  auStack_c0[0x19] = 0;
  auStack_c0[0x12] = 0;
  auStack_c0[0x13] = 0;
  auStack_c0[0x14] = 0;
  auStack_c0[0x15] = 0;
  auStack_c0[0xe] = 0;
  auStack_c0[0xf] = 0;
  auStack_c0[0x10] = 0;
  auStack_c0[0x11] = 0;
  auStack_c0[10] = 0;
  auStack_c0[0xb] = 0;
  auStack_c0[0xc] = 0;
  auStack_c0[0xd] = 0;
  auStack_c0[6] = 0;
  auStack_c0[7] = 0;
  auStack_c0[8] = 0;
  auStack_c0[9] = 0;
  auStack_c0[2] = 0;
  auStack_c0[3] = 0;
  auStack_c0[4] = 0;
  auStack_c0[5] = 0;
  s[0xf] = 0;
  auStack_c0[0] = 0;
  auStack_c0[1] = 0;
  if (key_len < 0x81) {
    local_3c8[0x3e] = 0x118596;
    local_3c8[0x3f] = 0;
    memcpy(s + 0xf,key,(ulong)key_len);
  }
  else {
    local_3c8[0x3e] = 0x1185b2;
    local_3c8[0x3f] = 0;
    Hacl_Hash_Blake2b_hash_with_key((uint8_t *)(s + 0xf),0x40,key,key_len,(uint8_t *)0x0,0);
  }
  output = local_3c8 + 0x20;
  local_3c8[0x3c] = 0x36363636;
  local_3c8[0x3d] = 0x36363636;
  local_3c8[0x3e] = 0x36363636;
  local_3c8[0x3f] = 0x36363636;
  local_3c8[0x38] = 0x36363636;
  local_3c8[0x39] = 0x36363636;
  local_3c8[0x3a] = 0x36363636;
  local_3c8[0x3b] = 0x36363636;
  local_3c8[0x34] = 0x36363636;
  local_3c8[0x35] = 0x36363636;
  local_3c8[0x36] = 0x36363636;
  local_3c8[0x37] = 0x36363636;
  local_3c8[0x30] = 0x36363636;
  local_3c8[0x31] = 0x36363636;
  local_3c8[0x32] = 0x36363636;
  local_3c8[0x33] = 0x36363636;
  local_3c8[0x2c] = 0x36363636;
  local_3c8[0x2d] = 0x36363636;
  local_3c8[0x2e] = 0x36363636;
  local_3c8[0x2f] = 0x36363636;
  local_3c8[0x28] = 0x36363636;
  local_3c8[0x29] = 0x36363636;
  local_3c8[0x2a] = 0x36363636;
  local_3c8[0x2b] = 0x36363636;
  local_3c8[0x24] = 0x36363636;
  local_3c8[0x25] = 0x36363636;
  local_3c8[0x26] = 0x36363636;
  local_3c8[0x27] = 0x36363636;
  local_3c8[0x20] = 0x36363636;
  local_3c8[0x21] = 0x36363636;
  local_3c8[0x22] = 0x36363636;
  local_3c8[0x23] = 0x36363636;
  lVar6 = 0;
  do {
    uVar8 = *(uint *)((long)s + lVar6 + 0x7c);
    uVar9 = *(uint *)((long)auStack_c0 + lVar6);
    uVar7 = *(uint *)((long)auStack_c0 + lVar6 + 4);
    uVar1 = *(uint *)((long)local_3c8 + lVar6 + 0x84);
    uVar2 = *(uint *)((long)local_3c8 + lVar6 + 0x88);
    uVar3 = *(uint *)((long)local_3c8 + lVar6 + 0x8c);
    *(uint *)((long)output + lVar6) =
         *(uint *)((long)s + lVar6 + 0x78) ^ *(uint *)((long)output + lVar6);
    *(uint *)((long)local_3c8 + lVar6 + 0x84) = uVar8 ^ uVar1;
    *(uint *)((long)local_3c8 + lVar6 + 0x88) = uVar9 ^ uVar2;
    *(uint *)((long)local_3c8 + lVar6 + 0x8c) = uVar7 ^ uVar3;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x80);
  local_3c8[0x1c] = 0x5c5c5c5c;
  local_3c8[0x1d] = 0x5c5c5c5c;
  local_3c8[0x1e] = 0x5c5c5c5c;
  local_3c8[0x1f] = 0x5c5c5c5c;
  local_3c8[0x18] = 0x5c5c5c5c;
  local_3c8[0x19] = 0x5c5c5c5c;
  local_3c8[0x1a] = 0x5c5c5c5c;
  local_3c8[0x1b] = 0x5c5c5c5c;
  local_3c8[0x14] = 0x5c5c5c5c;
  local_3c8[0x15] = 0x5c5c5c5c;
  local_3c8[0x16] = 0x5c5c5c5c;
  local_3c8[0x17] = 0x5c5c5c5c;
  local_3c8[0x10] = 0x5c5c5c5c;
  local_3c8[0x11] = 0x5c5c5c5c;
  local_3c8[0x12] = 0x5c5c5c5c;
  local_3c8[0x13] = 0x5c5c5c5c;
  local_3c8[0xc] = 0x5c5c5c5c;
  local_3c8[0xd] = 0x5c5c5c5c;
  local_3c8[0xe] = 0x5c5c5c5c;
  local_3c8[0xf] = 0x5c5c5c5c;
  local_3c8[8] = 0x5c5c5c5c;
  local_3c8[9] = 0x5c5c5c5c;
  local_3c8[10] = 0x5c5c5c5c;
  local_3c8[0xb] = 0x5c5c5c5c;
  local_3c8[4] = 0x5c5c5c5c;
  local_3c8[5] = 0x5c5c5c5c;
  local_3c8[6] = 0x5c5c5c5c;
  local_3c8[7] = 0x5c5c5c5c;
  local_3c8[0] = 0x5c5c5c5c;
  local_3c8[1] = 0x5c5c5c5c;
  local_3c8[2] = 0x5c5c5c5c;
  local_3c8[3] = 0x5c5c5c5c;
  lVar6 = 0;
  do {
    uVar8 = *(uint *)((long)s + lVar6 + 0x7c);
    uVar9 = *(uint *)((long)auStack_c0 + lVar6);
    uVar7 = *(uint *)((long)auStack_c0 + lVar6 + 4);
    *(uint *)((long)local_3c8 + lVar6) =
         *(uint *)((long)s + lVar6 + 0x78) ^ *(uint *)((long)local_3c8 + lVar6);
    *(uint *)((long)local_3c8 + lVar6 + 4) = uVar8 ^ *(uint *)((long)local_3c8 + lVar6 + 4);
    *(uint *)((long)local_3c8 + lVar6 + 8) = uVar9 ^ *(uint *)((long)local_3c8 + lVar6 + 8);
    *(uint *)((long)local_3c8 + lVar6 + 0xc) = uVar7 ^ *(uint *)((long)local_3c8 + lVar6 + 0xc);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x80);
  s[0xd] = 0;
  s[0xe] = 0;
  s[0xb] = 0;
  s[0xc] = 0;
  s[9] = 0;
  s[10] = 0;
  s[7] = 0;
  s[8] = 0;
  s[5] = 0;
  s[6] = 0;
  s[3] = 0;
  s[4] = 0;
  s[1] = 0;
  s[2] = 0;
  wv[0xf] = 0;
  s[0] = 0;
  uVar11 = 0x118689;
  Hacl_Hash_Blake2b_init(wv + 0xf,0,0x40);
  if (data_len == 0) {
    puVar5 = wv1;
    wv[0xd] = 0;
    wv[0xe] = 0;
    wv[0xb] = 0;
    wv[0xc] = 0;
    wv[9] = 0;
    wv[10] = 0;
    wv[7] = 0;
    wv[8] = 0;
    wv[5] = 0;
    wv[6] = 0;
    wv[3] = 0;
    wv[4] = 0;
    wv[1] = 0;
    wv[2] = 0;
    wv1[0xf] = 0;
    wv[0] = 0;
    uVar8 = 0x80;
    rem = 0;
    puVar10 = output;
  }
  else {
    uVar7 = data_len & 0x7f;
    uVar8 = (data_len >> 7) - 1;
    uVar9 = uVar8;
    if (data_len < 0x80 || uVar7 != 0) {
      uVar9 = data_len >> 7;
    }
    prev_00._4_4_ = 0;
    prev_00._0_4_ = uVar9;
    uVar8 = data_len + uVar8 * -0x80;
    if (data_len < 0x80 || uVar7 != 0) {
      uVar8 = uVar7;
    }
    uVar9 = uVar9 * 0x80;
    local_40 = (uint *)(data + uVar9);
    wv[0xd] = 0;
    wv[0xe] = 0;
    wv[0xb] = 0;
    wv[0xc] = 0;
    wv[9] = 0;
    wv[10] = 0;
    wv[7] = 0;
    wv[8] = 0;
    wv[5] = 0;
    wv[6] = 0;
    wv[3] = 0;
    wv[4] = 0;
    wv[1] = 0;
    wv[2] = 0;
    wv1[0xf] = 0;
    wv[0] = 0;
    prev._8_8_ = uVar11;
    prev._0_8_ = 1;
    local_48 = dst;
    local_38 = data;
    Hacl_Hash_Blake2b_update_multi
              (0x80,wv1 + 0xf,wv + 0xf,(FStar_UInt128_uint128)prev,(uint8_t *)0x0,0);
    dst = local_48;
    wv0[0xd] = 0;
    wv0[0xe] = 0;
    wv0[0xb] = 0;
    wv0[0xc] = 0;
    wv0[9] = 0;
    wv0[10] = 0;
    wv0[7] = 0;
    wv0[8] = 0;
    wv0[5] = 0;
    wv0[6] = 0;
    wv0[3] = 0;
    wv0[4] = 0;
    wv0[1] = 0;
    wv0[2] = 0;
    uStack_2c8 = 0;
    wv0[0] = 0;
    prev_00._8_8_ = uVar11;
    Hacl_Hash_Blake2b_update_multi
              (uVar9,&uStack_2c8,wv + 0xf,(FStar_UInt128_uint128)prev_00,(uint8_t *)0x80,0);
    puVar5 = wv0;
    wv1[0xd] = 0;
    wv1[0xe] = 0;
    wv1[0xb] = 0;
    wv1[0xc] = 0;
    wv1[9] = 0;
    wv1[10] = 0;
    wv1[7] = 0;
    wv1[8] = 0;
    wv1[5] = 0;
    wv1[6] = 0;
    wv1[3] = 0;
    wv1[4] = 0;
    wv1[1] = 0;
    wv1[2] = 0;
    wv0[0xf] = 0;
    wv1[0] = 0;
    rem = uVar9 + 0x80;
    puVar10 = local_40;
  }
  prev_01._8_8_ = uVar11;
  prev_01._0_8_ = puVar10;
  Hacl_Hash_Blake2b_update_last
            (uVar8,puVar5 + 0xf,wv + 0xf,(FStar_UInt128_uint128)prev_01,rem,(uint8_t *)0x0);
  puVar5 = wv + 0xf;
  Hacl_Hash_Blake2b_finish(0x40,(uint8_t *)output,puVar5);
  uVar12 = 0x118834;
  Hacl_Hash_Blake2b_init(puVar5,0,0x40);
  wv[0xd] = 0;
  wv[0xe] = 0;
  wv[0xb] = 0;
  wv[0xc] = 0;
  wv[9] = 0;
  wv[10] = 0;
  wv[7] = 0;
  wv[8] = 0;
  wv[5] = 0;
  wv[6] = 0;
  wv[3] = 0;
  wv[4] = 0;
  wv[1] = 0;
  wv[2] = 0;
  wv1[0xf] = 0;
  wv[0] = 0;
  prev_02._8_8_ = uVar12;
  prev_02._0_8_ = 1;
  Hacl_Hash_Blake2b_update_multi
            (0x80,wv1 + 0xf,puVar5,(FStar_UInt128_uint128)prev_02,(uint8_t *)0x0,0);
  wv0[0xd] = 0;
  wv0[0xe] = 0;
  wv0[0xb] = 0;
  wv0[0xc] = 0;
  wv0[9] = 0;
  wv0[10] = 0;
  wv0[7] = 0;
  wv0[8] = 0;
  wv0[5] = 0;
  wv0[6] = 0;
  wv0[3] = 0;
  wv0[4] = 0;
  wv0[1] = 0;
  wv0[2] = 0;
  uStack_2c8 = 0;
  wv0[0] = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar12;
  Hacl_Hash_Blake2b_update_multi
            (0,&uStack_2c8,puVar5,(FStar_UInt128_uint128)(auVar4 << 0x40),(uint8_t *)0x80,0);
  wv1[0xd] = 0;
  wv1[0xe] = 0;
  wv1[0xb] = 0;
  wv1[0xc] = 0;
  wv1[9] = 0;
  wv1[10] = 0;
  wv1[7] = 0;
  wv1[8] = 0;
  wv1[5] = 0;
  wv1[6] = 0;
  wv1[3] = 0;
  wv1[4] = 0;
  wv1[1] = 0;
  wv1[2] = 0;
  wv0[0xf] = 0;
  wv1[0] = 0;
  prev_03._8_8_ = uVar12;
  prev_03._0_8_ = output;
  Hacl_Hash_Blake2b_update_last
            (0x40,wv0 + 0xf,puVar5,(FStar_UInt128_uint128)prev_03,0x80,(uint8_t *)0x0);
  Hacl_Hash_Blake2b_finish(0x40,dst,puVar5);
  return;
}

Assistant:

void
Hacl_HMAC_compute_blake2b_32(
  uint8_t *dst,
  uint8_t *key,
  uint32_t key_len,
  uint8_t *data,
  uint32_t data_len
)
{
  uint32_t l = 128U;
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t key_block[l];
  memset(key_block, 0U, l * sizeof (uint8_t));
  uint8_t *nkey = key_block;
  uint32_t ite;
  if (key_len <= 128U)
  {
    ite = key_len;
  }
  else
  {
    ite = 64U;
  }
  uint8_t *zeroes = key_block + ite;
  KRML_MAYBE_UNUSED_VAR(zeroes);
  if (key_len <= 128U)
  {
    memcpy(nkey, key, key_len * sizeof (uint8_t));
  }
  else
  {
    Hacl_Hash_Blake2b_hash_with_key(nkey, 64U, key, key_len, NULL, 0U);
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t ipad[l];
  memset(ipad, 0x36U, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = ipad[i];
    uint8_t yi = key_block[i];
    ipad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t opad[l];
  memset(opad, 0x5cU, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = opad[i];
    uint8_t yi = key_block[i];
    opad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  uint64_t s[16U] = { 0U };
  Hacl_Hash_Blake2b_init(s, 0U, 64U);
  uint64_t *s0 = s;
  uint8_t *dst1 = ipad;
  if (data_len == 0U)
  {
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), 128U, ipad);
  }
  else
  {
    uint32_t block_len = 128U;
    uint32_t n_blocks0 = data_len / block_len;
    uint32_t rem0 = data_len % block_len;
    K___uint32_t_uint32_t scrut;
    if (n_blocks0 > 0U && rem0 == 0U)
    {
      uint32_t n_blocks_ = n_blocks0 - 1U;
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = data_len - n_blocks_ * block_len });
    }
    else
    {
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
    }
    uint32_t n_blocks = scrut.fst;
    uint32_t rem_len = scrut.snd;
    uint32_t full_blocks_len = n_blocks * block_len;
    uint8_t *full_blocks = data;
    uint8_t *rem = data + full_blocks_len;
    uint64_t wv[16U] = { 0U };
    Hacl_Hash_Blake2b_update_multi(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), ipad, 1U);
    uint64_t wv0[16U] = { 0U };
    Hacl_Hash_Blake2b_update_multi(n_blocks * 128U,
      wv0,
      s0,
      FStar_UInt128_uint64_to_uint128((uint64_t)block_len),
      full_blocks,
      n_blocks);
    uint64_t wv1[16U] = { 0U };
    Hacl_Hash_Blake2b_update_last(rem_len,
      wv1,
      s0,
      FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
        FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
      rem_len,
      rem);
  }
  Hacl_Hash_Blake2b_finish(64U, dst1, s0);
  uint8_t *hash1 = ipad;
  Hacl_Hash_Blake2b_init(s0, 0U, 64U);
  uint32_t block_len = 128U;
  uint32_t n_blocks0 = 64U / block_len;
  uint32_t rem0 = 64U % block_len;
  K___uint32_t_uint32_t scrut;
  if (n_blocks0 > 0U && rem0 == 0U)
  {
    uint32_t n_blocks_ = n_blocks0 - 1U;
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = 64U - n_blocks_ * block_len });
  }
  else
  {
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
  }
  uint32_t n_blocks = scrut.fst;
  uint32_t rem_len = scrut.snd;
  uint32_t full_blocks_len = n_blocks * block_len;
  uint8_t *full_blocks = hash1;
  uint8_t *rem = hash1 + full_blocks_len;
  uint64_t wv[16U] = { 0U };
  Hacl_Hash_Blake2b_update_multi(128U, wv, s0, FStar_UInt128_uint64_to_uint128(0ULL), opad, 1U);
  uint64_t wv0[16U] = { 0U };
  Hacl_Hash_Blake2b_update_multi(n_blocks * 128U,
    wv0,
    s0,
    FStar_UInt128_uint64_to_uint128((uint64_t)block_len),
    full_blocks,
    n_blocks);
  uint64_t wv1[16U] = { 0U };
  Hacl_Hash_Blake2b_update_last(rem_len,
    wv1,
    s0,
    FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
      FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
    rem_len,
    rem);
  Hacl_Hash_Blake2b_finish(64U, dst, s0);
}